

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int load_column(ParseData *lParse,int varNum,long fRow,long nRows,void *data,char *undef)

{
  int iVar1;
  uchar *array;
  long lVar2;
  long lVar3;
  long lVar4;
  iteratorCol *piVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int status;
  ParseData *local_98;
  size_t local_90;
  char msg [80];
  
  status = 0;
  piVar5 = lParse->colData + varNum;
  if (lParse->hdutype == 0) {
    ffgpf(piVar5->fptr,piVar5->datatype,fRow,nRows,data,undef,(int *)msg,&status);
    if (DEBUG_PIXFILTER != 0) {
      printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",fRow,nRows,(ulong)(uint)status);
    }
  }
  else {
    lVar8 = piVar5->repeat * nRows;
    iVar1 = piVar5->datatype;
    if (iVar1 == 0x52) {
      ffgcfd(piVar5->fptr,piVar5->colnum,fRow,1,lVar8,(double *)data,undef,(int *)msg,&status);
    }
    else if (iVar1 == 0xe) {
      ffgcfl(piVar5->fptr,piVar5->colnum,fRow,1,lVar8,(char *)data,undef,(int *)msg,&status);
    }
    else if (iVar1 == 0x10) {
      ffgcfs(piVar5->fptr,piVar5->colnum,fRow,1,nRows,(char **)data,undef,(int *)msg,&status);
    }
    else if (iVar1 == 0x29) {
      ffgcfj(piVar5->fptr,piVar5->colnum,fRow,1,lVar8,(long *)data,undef,(int *)msg,&status);
    }
    else if (iVar1 == 0xb) {
      local_90 = ((piVar5->repeat + 7) / 8) * nRows;
      local_98 = lParse;
      array = (uchar *)malloc(local_90);
      lVar4 = 0;
      ffgcvb(piVar5->fptr,piVar5->colnum,fRow,1,local_90,'\0',array,(int *)msg,&status);
      lVar8 = piVar5->repeat;
      lVar2 = lVar8;
      if (lVar8 < 1) {
        lVar2 = lVar4;
      }
      if (nRows < 1) {
        nRows = lVar4;
      }
      for (; lVar4 != nRows; lVar4 = lVar4 + 1) {
        lVar3 = lVar4 * ((lVar8 + 7) / 8) + 1;
        for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
          uVar7 = (uint)lVar6 & 7;
          *(byte *)(*(long *)((long)data + lVar4 * 8) + lVar6) =
               (array[lVar3] >> ((byte)uVar7 ^ 7) & 1) == 0 ^ 0x31;
          lVar3 = lVar3 + (ulong)(uVar7 == 7);
        }
        *(undefined1 *)(*(long *)((long)data + lVar4 * 8) + lVar2) = 0;
      }
      if (array == (uchar *)0x0) {
        printf("invalid free((char *)bytes) at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c",
               0xa6e);
        lParse = local_98;
      }
      else {
        free(array);
        lParse = local_98;
      }
    }
    else {
      snprintf(msg,0x50,"load_column: unexpected datatype %d");
      ffpmsg(msg);
    }
  }
  if (status == 0) {
    iVar1 = 0;
  }
  else {
    lParse->status = status;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int load_column( ParseData *lParse, int varNum, long fRow, long nRows,
                        void *data, char *undef )
{
   iteratorCol *var;
   long nelem,nbytes,row,len,idx;
   char **bitStrs, msg[80];
   unsigned char *bytes;
   int status = 0, anynul;

   var = lParse->colData+varNum;
   if (lParse->hdutype == IMAGE_HDU) {
    /* This test would need to be on a per varNum basis to support
     * cross HDU operations */
    fits_read_imgnull(var->fptr, var->datatype, fRow, nRows,
                data, undef, &anynul, &status);
    if (DEBUG_PIXFILTER)
        printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",
                        fRow, nRows, status);
  } else { 

   nelem = nRows * var->repeat;

   switch( var->datatype ) {
   case TBYTE:
      nbytes = ((var->repeat+7)/8) * nRows;
      bytes = (unsigned char *)malloc( nbytes * sizeof(char) );

      ffgcvb(var->fptr, var->colnum, fRow, 1L, nbytes,
             0, bytes, &anynul, &status);

      nelem = var->repeat;
      bitStrs = (char **)data;
      for( row=0; row<nRows; row++ ) {
         idx = (row)*( (nelem+7)/8 ) + 1;
         for(len=0; len<nelem; len++) {
            if( bytes[idx] & (1<<(7-len%8)) )
               bitStrs[row][len] = '1';
            else
               bitStrs[row][len] = '0';
            if( len%8==7 ) idx++;
         }
         bitStrs[row][len] = '\0';
      }

      FREE( (char *)bytes );
      break;
   case TSTRING:
      ffgcfs(var->fptr, var->colnum, fRow, 1L, nRows,
             (char **)data, undef, &anynul, &status);
      break;
   case TLOGICAL:
      ffgcfl(var->fptr, var->colnum, fRow, 1L, nelem,
             (char *)data, undef, &anynul, &status);
      break;
   case TLONG:
      ffgcfj(var->fptr, var->colnum, fRow, 1L, nelem,
             (long *)data, undef, &anynul, &status);
      break;
   case TDOUBLE:
      ffgcfd(var->fptr, var->colnum, fRow, 1L, nelem,
             (double *)data, undef, &anynul, &status);
      break;
   default:
      snprintf(msg,80,"load_column: unexpected datatype %d", var->datatype);
      ffpmsg(msg);
   }
  }
   if( status ) {
      lParse->status = status;
      return pERROR;
   }

   return 0;
}